

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O3

bool check_owner_password_V5(string *owner_password,EncryptionData *data)

{
  int iVar1;
  bool bVar2;
  string owner_data;
  string password;
  string validation_salt;
  string user_data;
  long *local_b8;
  size_t local_b0;
  long local_a8 [2];
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::substr((ulong)&local_38,(ulong)&data->U);
  std::__cxx11::string::substr((ulong)&local_b8,(ulong)&data->O);
  std::__cxx11::string::substr((ulong)&local_58,(ulong)&data->O);
  std::__cxx11::string::substr((ulong)&local_78,(ulong)owner_password);
  hash_V5(&local_98,&local_78,&local_58,&local_38,data);
  if (local_98._M_string_length == local_b0) {
    if (local_98._M_string_length == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(local_98._M_dataplus._M_p,local_b8,local_98._M_string_length);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

static bool
check_owner_password_V5(std::string const& owner_password, QPDF::EncryptionData const& data)
{
    // Algorithm 3.12 from the PDF 1.7 extension level 3

    std::string user_data = data.getU().substr(0, 48);
    std::string owner_data = data.getO().substr(0, 32);
    std::string validation_salt = data.getO().substr(32, 8);
    std::string password = truncate_password_V5(owner_password);
    return (hash_V5(password, validation_salt, user_data, data) == owner_data);
}